

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_538342::Pl_Track::~Pl_Track(Pl_Track *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ee068;
  pcVar2 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar1 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_Track(char const* identifier, Pipeline* next) :
            Pipeline(identifier, next)
        {
            if (!next) {
                throw std::logic_error("Attempt to create Pl_Track with nullptr as next");
            }
        }